

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fthash.c
# Opt level: O3

FT_Hashnode * hash_bucket(FT_Hashkey key,FT_Hash hash)

{
  FT_Hashnode *ppFVar1;
  FT_Hashkey *pFVar2;
  FT_Bool FVar3;
  FT_ULong FVar4;
  FT_Hashnode *ppFVar5;
  FT_Hashkey local_28;
  
  ppFVar1 = hash->table;
  local_28 = key;
  FVar4 = (*hash->lookup)(&local_28);
  ppFVar5 = ppFVar1 + FVar4 % (ulong)hash->size;
  pFVar2 = &(*ppFVar5)->key;
  while ((pFVar2 != (FT_Hashkey *)0x0 && (FVar3 = (*hash->compare)(pFVar2,&local_28), FVar3 == '\0')
         )) {
    ppFVar5 = ppFVar5 + -1;
    if (ppFVar5 < ppFVar1) {
      ppFVar5 = ppFVar1 + (hash->size - 1);
    }
    pFVar2 = &(*ppFVar5)->key;
  }
  return ppFVar5;
}

Assistant:

static FT_Hashnode*
  hash_bucket( FT_Hashkey  key,
               FT_Hash     hash )
  {
    FT_ULong      res = 0;
    FT_Hashnode*  bp  = hash->table;
    FT_Hashnode*  ndp;


    res = (hash->lookup)( &key );

    ndp = bp + ( res % hash->size );
    while ( *ndp )
    {
      if ( (hash->compare)( &(*ndp)->key, &key ) )
        break;

      ndp--;
      if ( ndp < bp )
        ndp = bp + ( hash->size - 1 );
    }

    return ndp;
  }